

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

void __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_ExprCounter>::ReadColumnSizes<true>
          (NLReader<mp::internal::TextReader<fmt::Locale>,_ExprCounter> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ArgList local_58;
  ulong local_48 [3];
  
  iVar3 = (this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_vars;
  uVar4 = iVar3 - 1;
  uVar1 = TextReader<fmt::Locale>::ReadUInt<int>(this->reader_);
  if (uVar1 != uVar4) {
    local_48[0] = (ulong)uVar4;
    local_58.field_1.values_ = (Value *)local_48;
    local_58.types_ = 2;
    TextReader<fmt::Locale>::DoReportError
              (this->reader_,(this->reader_->super_ReaderBase).token_,(CStringRef)0x13a061,&local_58
              );
  }
  TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
  if (1 < iVar3) {
    iVar3 = 0;
    do {
      iVar2 = TextReader<fmt::Locale>::ReadUInt<int>(this->reader_);
      if (iVar2 < iVar3) {
        local_48[0] = 0;
        local_48[1] = 0;
        local_58.types_ = 0;
        local_58.field_1.values_ = (Value *)local_48;
        TextReader<fmt::Locale>::DoReportError
                  (this->reader_,(this->reader_->super_ReaderBase).token_,(CStringRef)0x13a06d,
                   &local_58);
      }
      TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
      uVar4 = uVar4 - 1;
      iVar3 = iVar2;
    } while (uVar4 != 0);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadColumnSizes() {
  int num_sizes = header_.num_vars - 1;
  if (reader_.ReadUInt() != num_sizes)
    reader_.ReportError("expected {}", num_sizes);
  reader_.ReadTillEndOfLine();
  typename Handler::ColumnSizeHandler size_handler = handler_.OnColumnSizes();
  int prev_size = 0;
  for (int i = 0; i < num_sizes; ++i) {
    int size = reader_.ReadUInt();
    if (CUMULATIVE) {
      if (size < prev_size)
        reader_.ReportError("invalid column offset");
      size -= prev_size;
      prev_size += size;
    }
    size_handler.Add(size);
    reader_.ReadTillEndOfLine();
  }
}